

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_lat.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  undefined4 in_EAX;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *__s;
  size_t __size;
  int opt;
  undefined8 uStack_28;
  
  if (argc == 4) {
    pcVar1 = argv[1];
    uStack_28._0_4_ = in_EAX;
    iVar2 = atoi(argv[2]);
    iVar3 = atoi(argv[3]);
    iVar4 = nn_socket(1,0x10);
    if (iVar4 == -1) {
      __assert_fail("s != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/local_lat.c"
                    ,0x35,"int main(int, char **)");
    }
    uStack_28 = CONCAT44(1,(undefined4)uStack_28);
    iVar5 = nn_setsockopt(iVar4,0xfffffffd,1,(long)&uStack_28 + 4,4);
    if (iVar5 != 0) {
      __assert_fail("rc == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/local_lat.c"
                    ,0x38,"int main(int, char **)");
    }
    iVar5 = nn_bind(iVar4,pcVar1);
    if (iVar5 < 0) {
      __assert_fail("rc >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/local_lat.c"
                    ,0x3a,"int main(int, char **)");
    }
    __size = (size_t)iVar2;
    __s = malloc(__size);
    if (__s == (void *)0x0) {
      __assert_fail("buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/local_lat.c"
                    ,0x3d,"int main(int, char **)");
    }
    memset(__s,0x6f,__size);
    for (; iVar3 != 0; iVar3 = iVar3 + -1) {
      iVar5 = nn_recv(iVar4,__s,__size,0);
      if (iVar5 != iVar2) {
        __assert_fail("nbytes == (int)sz",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/local_lat.c"
                      ,0x42,"int main(int, char **)");
      }
      iVar5 = nn_send(iVar4,__s,__size);
      if (iVar5 != iVar2) {
        __assert_fail("nbytes == (int)sz",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/local_lat.c"
                      ,0x44,"int main(int, char **)");
      }
    }
    free(__s);
    iVar2 = nn_close(iVar4);
    iVar3 = 0;
    if (iVar2 != 0) {
      __assert_fail("rc == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/local_lat.c"
                    ,0x4a,"int main(int, char **)");
    }
  }
  else {
    puts("usage: local_lat <bind-to> <msg-size> <roundtrips>");
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int main (int argc, char *argv [])
{
    const char *bind_to;
    size_t sz;
    int rts;
    char *buf;
    int nbytes;
    int s;
    int rc;
    int i;
    int opt;

    if (argc != 4) {
        printf ("usage: local_lat <bind-to> <msg-size> <roundtrips>\n");
        return 1;
    }
    bind_to = argv [1];
    sz = atoi (argv [2]);
    rts = atoi (argv [3]);

    s = nn_socket (AF_SP, NN_PAIR);
    assert (s != -1);
    opt = 1;
    rc = nn_setsockopt (s, NN_TCP, NN_TCP_NODELAY, &opt, sizeof (opt));
    assert (rc == 0);
    rc = nn_bind (s, bind_to);
    assert (rc >= 0);

    buf = malloc (sz);
    assert (buf);
    memset (buf, 111, sz);

    for (i = 0; i != rts; i++) {
        nbytes = nn_recv (s, buf, sz, 0);
        assert (nbytes == (int)sz);
        nbytes = nn_send (s, buf, sz, 0);
        assert (nbytes == (int)sz);
    }

    free (buf);

    rc = nn_close (s);
    assert (rc == 0);

    return 0;
}